

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  int *mEnd;
  int *piVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  size_t offbaseFound;
  size_t local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  int *local_58;
  uint local_50;
  uint local_4c;
  BYTE *local_48;
  uint *local_40;
  BYTE *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  uVar9 = (ms->cParams).minMatch;
  uVar8 = 6;
  if (uVar9 < 6) {
    uVar8 = uVar9;
  }
  local_50 = 4;
  if (4 < uVar8) {
    local_50 = uVar8;
  }
  local_68 = pBVar3 + uVar2;
  uVar9 = *rep;
  pZVar4 = ms->dictMatchState;
  local_70 = (int *)(pZVar4->window).nextSrc;
  local_48 = (pZVar4->window).base;
  local_38 = local_48 + (pZVar4->window).dictLimit;
  uVar8 = ((int)src - ((int)local_68 + (int)local_38)) + (int)local_70;
  piVar14 = (int *)((long)src + (ulong)(uVar8 == 0));
  if (uVar8 < uVar9) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar20 = rep[1];
  local_40 = rep;
  if (uVar8 < uVar20) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar14 < local_58) {
    local_4c = ((int)local_48 - (int)local_70) + uVar2;
    local_60 = local_48 + -(ulong)local_4c;
    ilimit_w = iEnd + -8;
    do {
      piVar12 = (int *)((long)piVar14 + 1);
      uVar8 = (((int)piVar14 - (int)pBVar3) - uVar9) + 1;
      piVar15 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar15 = (int *)(local_48 + (uVar8 - local_4c));
      }
      bVar7 = true;
      if ((uVar8 - uVar2 < 0xfffffffd) && (*piVar15 == *piVar12)) {
        mEnd = iEnd;
        if (uVar8 < uVar2) {
          mEnd = local_70;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar14 + 5),(BYTE *)(piVar15 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,local_68);
        uVar19 = sVar10 + 4;
        bVar7 = false;
      }
      else {
        uVar19 = 0;
      }
      uVar18 = 1;
      uVar8 = uVar9;
      if (bVar7) {
        local_78 = 999999999;
        if (local_50 == 6) {
          uVar11 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)piVar14,(BYTE *)iEnd,&local_78);
        }
        else if (local_50 == 5) {
          uVar11 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)piVar14,(BYTE *)iEnd,&local_78);
        }
        else {
          uVar11 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)piVar14,(BYTE *)iEnd,&local_78);
        }
        uVar18 = local_78;
        piVar15 = piVar14;
        if (uVar11 <= uVar19) {
          uVar11 = uVar19;
          uVar18 = 1;
          piVar15 = piVar12;
        }
        piVar12 = piVar15;
        uVar19 = uVar11;
        if (3 < uVar19) {
          if (3 < uVar18) {
            uVar11 = (long)piVar12 + (-(long)pBVar3 - uVar18) + -0xfffffffd;
            pBVar16 = pBVar3;
            pBVar17 = local_68;
            if ((uint)uVar11 < uVar2) {
              pBVar16 = local_60;
              pBVar17 = local_38;
            }
            if ((src < piVar12) && (uVar11 = uVar11 & 0xffffffff, pBVar17 < pBVar16 + uVar11)) {
              pBVar16 = pBVar16 + uVar11;
              do {
                pBVar16 = pBVar16 + -1;
                piVar14 = (int *)((long)piVar12 + -1);
                if ((*(BYTE *)piVar14 != *pBVar16) ||
                   (uVar19 = uVar19 + 1, piVar12 = piVar14, piVar14 <= src)) break;
              } while (pBVar17 < pBVar16);
            }
            uVar8 = (int)uVar18 - 3;
            uVar20 = uVar9;
          }
          goto LAB_001db6d1;
        }
        uVar19 = (long)piVar14 - (long)src;
        piVar14 = (int *)((long)piVar14 + (uVar19 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar19);
        piVar12 = local_58;
      }
      else {
LAB_001db6d1:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001dba2c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001db9ee:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar11 = (long)piVar12 - (long)src;
        pBVar17 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar17 + uVar11) {
LAB_001dba6a:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar12) {
LAB_001dba4b:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < piVar12) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar12,(BYTE *)ilimit_w);
        }
        else {
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar6;
          if (0x10 < uVar11) {
            pBVar17 = seqStore->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar6;
            if (0x20 < (long)uVar11) {
              lVar13 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar13 + 0x20);
                uVar6 = puVar1[1];
                pBVar16 = pBVar17 + lVar13 + 0x20;
                *(undefined8 *)pBVar16 = *puVar1;
                *(undefined8 *)(pBVar16 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar13 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar16 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                lVar13 = lVar13 + 0x20;
              } while (pBVar16 + 0x20 < pBVar17 + uVar11);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar11;
        if (0xffff < uVar11) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5 = seqStore->sequences;
        psVar5->litLength = (U16)uVar11;
        psVar5->offBase = (U32)uVar18;
        if (uVar19 < 3) {
LAB_001dba0d:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar19 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001dba89:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(uVar19 - 3);
        seqStore->sequences = psVar5 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar14 = (int *)((long)piVar12 + uVar19);
        piVar12 = local_58;
        pBVar17 = local_60;
        src = piVar14;
        do {
          uVar9 = uVar8;
          if (piVar12 < piVar14) break;
          uVar9 = ((int)piVar14 - (int)pBVar3) - uVar20;
          pBVar16 = pBVar3;
          if (uVar9 < uVar2) {
            pBVar16 = pBVar17;
          }
          if ((uVar9 - uVar2 < 0xfffffffd) && (*(int *)(pBVar16 + uVar9) == *piVar14)) {
            piVar12 = iEnd;
            if (uVar9 < uVar2) {
              piVar12 = local_70;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar14 + 1),(BYTE *)((long)(pBVar16 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar12,local_68);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001dba2c;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001db9ee;
            pBVar17 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar17) goto LAB_001dba6a;
            if (iEnd < src) goto LAB_001dba4b;
            if (ilimit_w < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar6;
            }
            psVar5 = seqStore->sequences;
            psVar5->litLength = 0;
            psVar5->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_001dba0d;
            if (0xffff < sVar10 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001dba89;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar5->mlBase = (U16)(sVar10 + 1);
            seqStore->sequences = psVar5 + 1;
            piVar14 = (int *)((long)piVar14 + sVar10 + 4);
            bVar7 = true;
            piVar12 = local_58;
            pBVar17 = local_60;
            src = piVar14;
            uVar9 = uVar8;
            uVar8 = uVar20;
          }
          else {
            bVar7 = false;
            uVar9 = uVar20;
          }
          uVar20 = uVar9;
          uVar9 = uVar8;
        } while (bVar7);
      }
    } while (piVar14 < piVar12);
  }
  *local_40 = uVar9;
  local_40[1] = uVar20;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}